

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

string_t duckdb::StringValueScanner::RemoveEscape
                   (char *str_ptr,idx_t end,char escape,char quote,bool strict_mode,Vector *vector)

{
  bool bVar1;
  bool bVar2;
  idx_t cur_pos;
  idx_t iVar3;
  ulong uVar4;
  long lVar5;
  undefined7 in_register_00000011;
  idx_t len;
  char *pcVar6;
  Vector *vector_00;
  char cVar7;
  string_t removed_escapes;
  anon_union_16_2_67f50693_for_value local_38;
  
  len = CONCAT71(in_register_00000011,escape);
  uVar4 = 0;
  vector_00 = (Vector *)0x0;
  for (iVar3 = 0; end != iVar3; iVar3 = iVar3 + 1) {
    if ((str_ptr[iVar3] != escape) || (len = CONCAT71((int7)(len >> 8),1), (uVar4 & 1) != 0)) {
      if (str_ptr[iVar3] == quote) {
        vector_00 = (Vector *)(&vector_00->vector_type + (byte)((byte)uVar4 | !strict_mode));
      }
      else {
        vector_00 = (Vector *)&vector_00->field_0x1;
      }
      len = 0;
    }
    uVar4 = len & 0xffffffff;
  }
  local_38.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)vector,vector_00,len);
  pcVar6 = local_38._8_8_;
  if (local_38._0_4_ < 0xd) {
    pcVar6 = local_38.pointer.prefix;
  }
  bVar1 = false;
  lVar5 = 0;
  for (iVar3 = 0; end != iVar3; iVar3 = iVar3 + 1) {
    cVar7 = str_ptr[iVar3];
    if ((cVar7 != escape) || (bVar2 = true, bVar1)) {
      if ((cVar7 != quote) || (cVar7 = quote, (bool)(bVar1 | !strict_mode))) {
        pcVar6[lVar5] = cVar7;
        lVar5 = lVar5 + 1;
      }
      bVar2 = false;
    }
    bVar1 = bVar2;
  }
  string_t::Finalize((string_t *)&local_38.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38.pointer;
}

Assistant:

string_t StringValueScanner::RemoveEscape(const char *str_ptr, idx_t end, char escape, char quote, bool strict_mode,
                                          Vector &vector) {
	// Figure out the exact size
	idx_t str_pos = 0;
	bool just_escaped = false;
	for (idx_t cur_pos = 0; cur_pos < end; cur_pos++) {
		if (str_ptr[cur_pos] == escape && !just_escaped) {
			just_escaped = true;
		} else if (str_ptr[cur_pos] == quote) {
			if (just_escaped || !strict_mode) {
				str_pos++;
			}
			just_escaped = false;
		} else {
			just_escaped = false;
			str_pos++;
		}
	}

	auto removed_escapes = StringVector::EmptyString(vector, str_pos);
	auto removed_escapes_ptr = removed_escapes.GetDataWriteable();
	// Allocate string and copy it
	str_pos = 0;
	just_escaped = false;
	for (idx_t cur_pos = 0; cur_pos < end; cur_pos++) {
		const char c = str_ptr[cur_pos];
		if (c == escape && !just_escaped) {
			just_escaped = true;
		} else if (str_ptr[cur_pos] == quote) {
			if (just_escaped || !strict_mode) {
				removed_escapes_ptr[str_pos++] = c;
			}
			just_escaped = false;
		} else {
			just_escaped = false;
			removed_escapes_ptr[str_pos++] = c;
		}
	}
	removed_escapes.Finalize();
	return removed_escapes;
}